

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrload.c
# Opt level: O2

FT_Error pfr_extra_items_parse
                   (FT_Byte **pp,FT_Byte *limit,PFR_ExtraItem item_list,FT_Pointer item_data)

{
  PFR_ExtraItemRec_ *pPVar1;
  PFR_ExtraItem_ParseFunc p_Var2;
  FT_Error FVar3;
  byte *pbVar4;
  byte *pbVar5;
  PFR_ExtraItem_ParseFunc *pp_Var6;
  byte *pbVar7;
  byte *pbVar8;
  uint uVar9;
  bool bVar10;
  
  pbVar5 = *pp;
  FVar3 = 8;
  if (pbVar5 + 1 <= limit) {
    uVar9 = (uint)*pbVar5;
    pbVar8 = pbVar5 + 1;
LAB_00148437:
    do {
      do {
        pbVar7 = pbVar8;
        bVar10 = uVar9 == 0;
        uVar9 = uVar9 - 1;
        if (bVar10) {
          FVar3 = 0;
          pbVar5 = pbVar7;
          goto LAB_0014849f;
        }
        pbVar5 = pbVar7 + 2;
        pbVar4 = pbVar7;
        if ((limit < pbVar5) || (pbVar8 = pbVar5 + *pbVar7, pbVar4 = pbVar5, limit < pbVar8)) {
          FVar3 = 8;
          pbVar5 = pbVar4;
          goto LAB_0014849f;
        }
      } while (item_list == (PFR_ExtraItem)0x0);
      pp_Var6 = &item_list->parser;
      do {
        p_Var2 = *pp_Var6;
        if (p_Var2 == (PFR_ExtraItem_ParseFunc)0x0) goto LAB_00148437;
        pPVar1 = (PFR_ExtraItemRec_ *)(pp_Var6 + -1);
        pp_Var6 = pp_Var6 + 2;
      } while (pPVar1->type != (uint)pbVar7[1]);
      FVar3 = (*p_Var2)(pbVar5,pbVar8,item_data);
    } while (FVar3 == 0);
  }
LAB_0014849f:
  *pp = pbVar5;
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_extra_items_parse( FT_Byte*       *pp,
                         FT_Byte*        limit,
                         PFR_ExtraItem   item_list,
                         FT_Pointer      item_data )
  {
    FT_Error  error = FT_Err_Ok;
    FT_Byte*  p     = *pp;
    FT_UInt   num_items, item_type, item_size;


    PFR_CHECK( 1 );
    num_items = PFR_NEXT_BYTE( p );

    for ( ; num_items > 0; num_items-- )
    {
      PFR_CHECK( 2 );
      item_size = PFR_NEXT_BYTE( p );
      item_type = PFR_NEXT_BYTE( p );

      PFR_CHECK( item_size );

      if ( item_list )
      {
        PFR_ExtraItem  extra = item_list;


        for ( extra = item_list; extra->parser != NULL; extra++ )
        {
          if ( extra->type == item_type )
          {
            error = extra->parser( p, p + item_size, item_data );
            if ( error )
              goto Exit;

            break;
          }
        }
      }

      p += item_size;
    }

  Exit:
    *pp = p;
    return error;

  Too_Short:
    FT_ERROR(( "pfr_extra_items_parse: invalid extra items table\n" ));
    error = FT_THROW( Invalid_Table );
    goto Exit;
  }